

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void QPDFJob::parse_object_id(string *objspec,bool *trailer,int *obj,int *gen)

{
  int iVar1;
  long lVar2;
  long *local_40 [2];
  long local_30 [2];
  
  iVar1 = std::__cxx11::string::compare((char *)objspec);
  if (iVar1 == 0) {
    *trailer = true;
  }
  else {
    *trailer = false;
    iVar1 = QUtil::string_to_int((objspec->_M_dataplus)._M_p);
    *obj = iVar1;
    lVar2 = std::__cxx11::string::find((char)objspec,0x2c);
    if ((lVar2 != -1) && (lVar2 + 1U < objspec->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)objspec);
      iVar1 = QUtil::string_to_int((char *)local_40[0]);
      *gen = iVar1;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void
QPDFJob::parse_object_id(std::string const& objspec, bool& trailer, int& obj, int& gen)
{
    if (objspec == "trailer") {
        trailer = true;
    } else {
        trailer = false;
        obj = QUtil::string_to_int(objspec.c_str());
        size_t comma = objspec.find(',');
        if ((comma != std::string::npos) && (comma + 1 < objspec.length())) {
            gen = QUtil::string_to_int(objspec.substr(1 + comma, std::string::npos).c_str());
        }
    }
}